

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O1

KeyData * __thiscall
cfd::core::ExtPrivkey::DerivePrivkeyData
          (KeyData *__return_storage_ptr__,ExtPrivkey *this,string *string_path)

{
  ByteData fingerprint;
  ExtPrivkey key;
  Pubkey local_c0;
  ByteData local_a8;
  ExtPrivkey local_90;
  
  DerivePrivkey(&local_90,this,string_path);
  Privkey::GeneratePubkey(&local_c0,&this->privkey_,true);
  Pubkey::GetFingerprint(&local_a8,&local_c0,4);
  if (local_c0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  KeyData::KeyData(__return_storage_ptr__,&local_90,string_path,&local_a8);
  if (local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.privkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.privkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.serialize_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

KeyData ExtPrivkey::DerivePrivkeyData(const std::string& string_path) const {
  ExtPrivkey key = DerivePrivkey(string_path);
  auto fingerprint = privkey_.GeneratePubkey().GetFingerprint();
  return KeyData(key, string_path, fingerprint);
}